

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FeatureDescription::MergeFrom
          (FeatureDescription *this,FeatureDescription *from)

{
  bool bVar1;
  LogMessage *other;
  ulong uVar2;
  FeatureDescription *pFVar3;
  Arena *pAVar4;
  string *psVar5;
  FeatureType *this_00;
  FeatureType *from_00;
  LogFinisher local_85;
  uint32_t cached_has_bits;
  byte local_71;
  LogMessage local_70;
  FeatureDescription *local_38;
  FeatureDescription *from_local;
  FeatureDescription *this_local;
  FeatureDescription *local_20;
  string *local_18;
  FeatureDescription *local_10;
  
  local_71 = 0;
  local_38 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/Model.pb.cc"
               ,0x3fa);
    local_71 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_85,other);
  }
  if ((local_71 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_70);
  }
  _internal_name_abi_cxx11_(local_38);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pFVar3 = (FeatureDescription *)_internal_name_abi_cxx11_(local_38);
    this_local = pFVar3;
    local_20 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->name_,pFVar3,pAVar4);
  }
  _internal_shortdescription_abi_cxx11_(local_38);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_shortdescription_abi_cxx11_(local_38);
    local_18 = psVar5;
    local_10 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->shortdescription_,psVar5,pAVar4);
  }
  bVar1 = _internal_has_type(local_38);
  if (bVar1) {
    this_00 = _internal_mutable_type(this);
    from_00 = _internal_type(local_38);
    FeatureType::MergeFrom(this_00,from_00);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_38->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void FeatureDescription::MergeFrom(const FeatureDescription& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.FeatureDescription)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_name().empty()) {
    _internal_set_name(from._internal_name());
  }
  if (!from._internal_shortdescription().empty()) {
    _internal_set_shortdescription(from._internal_shortdescription());
  }
  if (from._internal_has_type()) {
    _internal_mutable_type()->::CoreML::Specification::FeatureType::MergeFrom(from._internal_type());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}